

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

double ON_MeshParameters::ToleranceFromObjectSize(double relative_tolerance,double actual_size)

{
  double dVar1;
  bool bVar2;
  double local_38;
  double e;
  double x;
  double tol;
  double actual_size_local;
  double relative_tolerance_local;
  
  x = 0.0;
  bVar2 = ON_IsValid(relative_tolerance);
  if ((((bVar2) && (bVar2 = ON_IsValid(actual_size), bVar2)) && (0.0 < relative_tolerance)) &&
     (0.0 < actual_size)) {
    actual_size_local = relative_tolerance;
    if (1.0 < relative_tolerance) {
      actual_size_local = 1.0;
    }
    if (0.5 <= actual_size_local) {
      local_38 = actual_size_local + actual_size_local + 2.0;
    }
    else {
      local_38 = actual_size_local * (actual_size_local * -4.0 + 6.0) + 1.0;
    }
    dVar1 = pow(10.0,-local_38);
    x = actual_size * dVar1;
  }
  return x;
}

Assistant:

double ON_MeshParameters::ToleranceFromObjectSize(
  double relative_tolerance,
  double actual_size
)
{
  // min_rel_tol creates the most facets
  //const double min_rel_tol = 5.0e-5;

  //max rel tol creates the fewest facets
  //const double max_rel_tol = 0.1;
  //m_relative_tolerance = 0.0;
  //if ( relative_tolerance <= 0.0 )
  //  m_relative_tolerance = max_rel_tol;
  //else if ( relative_tolerance >= 1.0 )
  //  m_relative_tolerance = min_rel_tol;
  //else
  //{
  //  ON_Interval e(log10(max_rel_tol),log10(min_rel_tol));
  //  m_relative_tolerance = pow(10.0,e.ParameterAt(relative_tolerance));
  //}

  double tol = 0.0;
  double x, e;
  if ( ON_IsValid(relative_tolerance) && ON_IsValid(actual_size)
       && relative_tolerance > 0.0 && actual_size > 0.0 )
  {
    if ( relative_tolerance > 1.0 )
      relative_tolerance = 1.0;

    //e = (relative_tolerance*(12.0 + relative_tolerance*(2.0*relative_tolerance - 9.0)));
    //e = (1.0 + relative_tolerance*(8.0 - 4.0*relative_tolerance));
    //e = 1.0 + relative_tolerance*4.0;
    //x = 5.0*pow(10.0,-e);

    e = (relative_tolerance < 0.5) 
      ? 1.0 + relative_tolerance*(6.0 - 4.0*relative_tolerance) // 1.0 + 4.0*relative_tolerance
      : 2.0 + 2.0*relative_tolerance;
    x = pow(10.0,-e);

    tol = actual_size*x;
  }
  return tol;
}